

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::EnumValueOptions::_InternalSerialize
          (EnumValueOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  uint8 *puVar4;
  Type *this_00;
  int index;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    bVar1 = this->deprecated_;
    *puVar4 = '\b';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar4 + 1);
  }
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar2 != index; index = index + 1) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_00 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    puVar4[0] = 0xba;
    puVar4[1] = '>';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,puVar4 + 2);
    target = UninterpretedOption::_InternalSerialize(this_00,puVar4,stream);
  }
  puVar4 = internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,1000,0x20000000,target,stream);
  pvVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return puVar4;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8),puVar4,stream);
  return puVar4;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* EnumValueOptions::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumValueOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool deprecated = 1 [default = false];
  if (cached_has_bits & 0x00000001u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(1, this->_internal_deprecated(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_._InternalSerialize(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumValueOptions)
  return target;
}